

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffDistTest2<unsigned_long,Blob<256>>(pfHash hash,bool drawDiagram)

{
  bool bVar1;
  reference this;
  byte in_SIL;
  code *in_RDI;
  int i;
  int keybit;
  bool result;
  Blob<256> h2;
  Blob<256> h1;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  unsigned_long k;
  int keycount;
  int keybits;
  Rand r;
  uint32_t in_stack_ffffffffffffff2c;
  Rand *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  Blob<256> *in_stack_ffffffffffffff48;
  Rand *in_stack_ffffffffffffff50;
  int local_a8;
  uint local_a4;
  byte local_9d;
  Blob<256> local_9c;
  Blob<256> local_7c;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_48;
  undefined1 local_30 [12];
  undefined4 local_24;
  int local_20;
  byte local_9;
  code *local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  Rand::Rand(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  local_20 = 0x40;
  local_24 = 0x200000;
  std::allocator<Blob<256>_>::allocator((allocator<Blob<256>_> *)0x1a0e85);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)in_stack_ffffffffffffff50,
             (size_type)in_stack_ffffffffffffff48,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::allocator<Blob<256>_>::~allocator((allocator<Blob<256>_> *)0x1a0eab);
  Blob<256>::Blob(&local_7c);
  Blob<256>::Blob(&local_9c);
  local_9d = 1;
  for (local_a4 = 0; (int)local_a4 < local_20; local_a4 = local_a4 + 1) {
    printf("Testing bit %d\n",(ulong)local_a4);
    for (local_a8 = 0; local_a8 < 0x200000; local_a8 = local_a8 + 1) {
      Rand::rand_p(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      (*local_8)(local_30,8,0,&local_7c);
      flipbit(local_30,8,local_a4);
      (*local_8)(local_30,8,0,&local_9c);
      Blob<256>::operator^
                (in_stack_ffffffffffffff48,
                 (Blob<256> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      this = std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::operator[]
                       (&local_48,(long)local_a8);
      Blob<256>::operator=(this,(Blob<256> *)&stack0xffffffffffffff38);
    }
    bVar1 = TestHashList<Blob<256>>
                      ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)h2.bytes._4_8_,
                       (bool)h2.bytes[3],(bool)h2.bytes[2],(bool)h2.bytes[1],(bool)h2.bytes[0],
                       result);
    local_9d = bVar1 & local_9d;
    printf("\n");
  }
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  return (bool)(local_9d & 1);
}

Assistant:

bool DiffDistTest2 ( pfHash hash, bool drawDiagram )
{
  Rand r(857374);

  int keybits = sizeof(keytype) * 8;
  const int keycount = 256*256*32;
  keytype k;
  
  std::vector<hashtype> hashes(keycount);
  hashtype h1,h2;

  bool result = true;

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    printf("Testing bit %d\n",keybit);

    for(int i = 0; i < keycount; i++)
    {
      r.rand_p(&k,sizeof(keytype));
      
      hash(&k,sizeof(keytype),0,&h1);
      flipbit(&k,sizeof(keytype),keybit);
      hash(&k,sizeof(keytype),0,&h2);

      hashes[i] = h1 ^ h2;
    }

    result &= TestHashList<hashtype>(hashes,true,true,drawDiagram);
    printf("\n");
  }

  return result;
}